

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase489::run(TestCase489 *this)

{
  Reader reader;
  Disposer *pDVar1;
  Server *pSVar2;
  long *plVar3;
  ClientHook *pCVar4;
  CapTableBuilder *pCVar5;
  WirePointer *pWVar6;
  undefined8 uVar7;
  Disposer *pDVar8;
  RequestHook *pRVar9;
  undefined8 *__n;
  void *__buf;
  void *__buf_00;
  int in_R8D;
  bool bVar10;
  Own<capnp::ClientHook> OVar11;
  Reader RVar12;
  int callCount;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response1;
  Client client2;
  WaitScope waitScope;
  Response<capnproto_test::capnp::test::TestAllTypes> response2;
  RemotePromise<capnproto_test::capnp::test::TestAllTypes> promise2;
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> promise1;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  request2;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request1;
  EventLoop loop;
  undefined1 local_26c [4];
  Own<capnp::Capability::Server> local_268;
  WirePointer *local_250;
  short local_244;
  int local_240;
  undefined8 *local_238;
  long *local_230;
  pointer_____offset_0x10___ *local_220;
  undefined8 *local_218;
  long *local_210;
  EventLoop *local_208;
  undefined4 local_200;
  Client local_1f8;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 *local_1c8;
  long *local_1c0;
  undefined1 local_1b0 [16];
  ClientHook *pCStack_1a0;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  local_198;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_160;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  local_128;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_f0;
  PointerReader local_b8;
  ArrayPtr<const_char> local_98;
  EventLoop local_88;
  Maybe<capnp::MessageSize> local_50;
  Maybe<capnp::MessageSize> local_38;
  
  kj::EventLoop::EventLoop(&local_88);
  local_200 = 0xffffffff;
  local_208 = &local_88;
  kj::EventLoop::enterScope(&local_88);
  local_26c = (undefined1  [4])0x0;
  local_268.ptr = (Server *)operator_new(0x20);
  (local_268.ptr)->thisHook = (ClientHook *)0x0;
  local_268.ptr[1]._vptr_Server = (_func_int **)0x6178a8;
  (local_268.ptr)->_vptr_Server = (_func_int **)&PTR_dispatchCall_00608828;
  local_268.ptr[1].thisHook = (ClientHook *)local_26c;
  __n = &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestExtendsDynamicImpl>::instance;
  local_268.disposer =
       (Disposer *)
       &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestExtendsDynamicImpl>::instance;
  OVar11 = Capability::Client::makeLocalClient(&local_1f8,&local_268);
  pSVar2 = local_268.ptr;
  if (local_268.ptr != (Server *)0x0) {
    local_268.ptr = (Server *)0x0;
    (**(local_268.disposer)->_vptr_Disposer)
              (local_268.disposer,
               (_func_int *)((long)&pSVar2->_vptr_Server + (long)pSVar2->_vptr_Server[-2]),
               OVar11.ptr);
  }
  local_1e8 = 0x6178a8;
  (*(local_1f8.hook.ptr)->_vptr_ClientHook[4])(&local_268);
  pCVar4 = local_1f8.hook.ptr;
  pSVar2 = local_268.ptr;
  pDVar1 = local_268.disposer;
  if (local_1f8.hook.ptr != (ClientHook *)0x0) {
    local_1f8.hook.ptr = (ClientHook *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_1f8.hook.disposer._4_4_,local_1f8.hook.disposer._0_4_)
    )((undefined8 *)CONCAT44(local_1f8.hook.disposer._4_4_,local_1f8.hook.disposer._0_4_),
      pCVar4->_vptr_ClientHook[-2] + (long)&pCVar4->_vptr_ClientHook);
  }
  (*pSVar2->_vptr_Server[4])(&local_218,pSVar2);
  local_220 = &Capability::Client::typeinfo;
  (**(code **)(*local_210 + 0x20))(&local_1f8);
  local_1b0._8_8_ = CONCAT44(local_1f8.hook.disposer._4_4_,local_1f8.hook.disposer._0_4_);
  pCStack_1a0 = local_1f8.hook.ptr;
  local_1b0._0_8_ = &capnproto_test::capnp::test::TestExtends::Client::typeinfo;
  local_38.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            (&local_f0,(Client *)local_1b0,&local_38);
  *(undefined4 *)local_f0.super_Builder._builder.data = 0x141;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_160,(int)&local_f0,__buf,(size_t)__n,in_R8D);
  local_50.ptr.isSet = false;
  capnproto_test::capnp::test::TestExtends::Client::graultRequest
            (&local_128,(Client *)local_1b0,&local_50);
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::send(&local_198,(int)&local_128,__buf_00,(size_t)__n,in_R8D);
  if ((local_26c != (undefined1  [4])0x0) && (kj::_::Debug::minSeverity < 3)) {
    local_1f8.hook.disposer._0_4_ = 0;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x1fb,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",(int *)&local_1f8,
               (int *)local_26c);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> *)&local_1f8,
             &local_198);
  reader._reader.segment._4_4_ = local_1f8.hook.disposer._4_4_;
  reader._reader.segment._0_4_ = local_1f8.hook.disposer._0_4_;
  reader._reader.capTable = (CapTableReader *)local_1f8.hook.ptr;
  reader._reader.data = (void *)local_1e8;
  reader._reader.pointers = (WirePointer *)uStack_1e0;
  reader._reader.dataSize = (undefined4)local_1d8;
  reader._reader.pointerCount = local_1d8._4_2_;
  reader._reader._38_2_ = local_1d8._6_2_;
  reader._reader._40_8_ = uStack_1d0;
  checkTestMessage(reader);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             &local_268,&local_160);
  bVar10 = local_244 == 0;
  local_b8.pointer = local_250;
  if (bVar10) {
    local_b8.pointer = (WirePointer *)0x0;
  }
  local_b8.nestingLimit = 0x7fffffff;
  if (!bVar10) {
    local_b8.nestingLimit = local_240;
  }
  local_b8.segment._0_4_ = 0;
  local_b8.segment._4_4_ = 0;
  local_b8.capTable._0_4_ = 0;
  local_b8.capTable._4_4_ = 0;
  if (!bVar10) {
    local_b8.segment._0_4_ = local_268.disposer._0_4_;
    local_b8.segment._4_4_ = local_268.disposer._4_4_;
    local_b8.capTable._0_4_ = local_268.ptr._0_4_;
    local_b8.capTable._4_4_ = local_268.ptr._4_4_;
  }
  RVar12 = PointerReader::getBlob<capnp::Text>(&local_b8,(void *)0x0,0);
  if (RVar12.super_StringPtr.content.size_ == 4) {
    if (((char)RVar12.super_StringPtr.content.ptr[1] != 'r' ||
        *RVar12.super_StringPtr.content.ptr != 0x6162) && kj::_::Debug::minSeverity < 3)
    goto LAB_00283a4b;
  }
  else {
    if (2 < kj::_::Debug::minSeverity) goto LAB_00283b10;
LAB_00283a4b:
    bVar10 = local_244 == 0;
    local_b8.pointer = local_250;
    if (bVar10) {
      local_b8.pointer = (WirePointer *)0x0;
    }
    local_b8.nestingLimit = 0x7fffffff;
    if (!bVar10) {
      local_b8.nestingLimit = local_240;
    }
    local_b8.segment._0_4_ = 0;
    local_b8.segment._4_4_ = 0;
    local_b8.capTable._0_4_ = 0;
    local_b8.capTable._4_4_ = 0;
    if (!bVar10) {
      local_b8.segment._0_4_ = local_268.disposer._0_4_;
      local_b8.segment._4_4_ = local_268.disposer._4_4_;
      local_b8.capTable._0_4_ = local_268.ptr._0_4_;
      local_b8.capTable._4_4_ = local_268.ptr._4_4_;
    }
    local_98 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_b8,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x203,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (response1.getX())\", \"bar\", response1.getX()"
               ,(char (*) [47])"failed: expected (\"bar\") == (response1.getX())",
               (char (*) [4])0x4e245b,(Reader *)&local_98);
  }
  if ((local_26c != (undefined1  [4])0x2) && (kj::_::Debug::minSeverity < 3)) {
    local_b8.segment._0_4_ = 2;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x205,ERROR,"\"failed: expected \" \"(2) == (callCount)\", 2, callCount",
               (char (*) [36])"failed: expected (2) == (callCount)",(int *)&local_b8,
               (int *)local_26c);
  }
LAB_00283b10:
  plVar3 = local_230;
  if (local_230 != (long *)0x0) {
    local_230 = (long *)0x0;
    (**(code **)*local_238)(local_238,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  plVar3 = local_1c0;
  if (local_1c0 != (long *)0x0) {
    local_1c0 = (long *)0x0;
    (**(code **)*local_1c8)(local_1c8,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  pDVar8 = local_198.hook.disposer;
  uVar7 = local_198.super_Builder._builder._32_8_;
  if (local_198.super_Builder._builder._32_8_ != 0) {
    local_198.super_Builder._builder.dataSize = 0;
    local_198.super_Builder._builder.pointerCount = 0;
    local_198.super_Builder._builder._38_2_ = 0;
    local_198.hook.disposer = (Disposer *)0x0;
    (**(local_198.hook.ptr)->_vptr_RequestHook)(local_198.hook.ptr,uVar7,8,pDVar8,pDVar8,0);
  }
  pWVar6 = local_198.super_Builder._builder.pointers;
  if (local_198.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_198.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_198.super_Builder._builder.data)
              (local_198.super_Builder._builder.data,
               (long)&(pWVar6->offsetAndKind).value + *(long *)((long)*pWVar6 + -0x10));
  }
  pCVar5 = local_198.super_Builder._builder.capTable;
  if (local_198.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_198.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_198.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_198.super_Builder._builder.segment,
      (pCVar5->super_CapTableReader)._vptr_CapTableReader[-2] +
      (long)&(pCVar5->super_CapTableReader)._vptr_CapTableReader);
  }
  pRVar9 = local_128.hook.ptr;
  if (local_128.hook.ptr != (RequestHook *)0x0) {
    local_128.hook.ptr = (RequestHook *)0x0;
    (**(local_128.hook.disposer)->_vptr_Disposer)
              (local_128.hook.disposer,
               pRVar9->_vptr_RequestHook[-2] + (long)&pRVar9->_vptr_RequestHook);
  }
  pDVar8 = local_160.hook.disposer;
  uVar7 = local_160.super_Builder._builder._32_8_;
  if (local_160.super_Builder._builder._32_8_ != 0) {
    local_160.super_Builder._builder.dataSize = 0;
    local_160.super_Builder._builder.pointerCount = 0;
    local_160.super_Builder._builder._38_2_ = 0;
    local_160.hook.disposer = (Disposer *)0x0;
    (**(local_160.hook.ptr)->_vptr_RequestHook)(local_160.hook.ptr,uVar7,8,pDVar8,pDVar8,0);
  }
  pWVar6 = local_160.super_Builder._builder.pointers;
  if (local_160.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_160.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_160.super_Builder._builder.data)
              (local_160.super_Builder._builder.data,
               (long)&(pWVar6->offsetAndKind).value + *(long *)((long)*pWVar6 + -0x10));
  }
  pCVar5 = local_160.super_Builder._builder.capTable;
  if (local_160.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_160.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_160.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_160.super_Builder._builder.segment,
      (pCVar5->super_CapTableReader)._vptr_CapTableReader[-2] +
      (long)&(pCVar5->super_CapTableReader)._vptr_CapTableReader);
  }
  pRVar9 = local_f0.hook.ptr;
  if (local_f0.hook.ptr != (RequestHook *)0x0) {
    local_f0.hook.ptr = (RequestHook *)0x0;
    (**(local_f0.hook.disposer)->_vptr_Disposer)
              (local_f0.hook.disposer,
               pRVar9->_vptr_RequestHook[-2] + (long)&pRVar9->_vptr_RequestHook);
  }
  pCVar4 = pCStack_1a0;
  if (pCStack_1a0 != (ClientHook *)0x0) {
    pCStack_1a0 = (ClientHook *)0x0;
    (*(code *)**(undefined8 **)local_1b0._8_8_)
              (local_1b0._8_8_,pCVar4->_vptr_ClientHook[-2] + (long)&pCVar4->_vptr_ClientHook);
  }
  plVar3 = local_210;
  if (local_210 != (long *)0x0) {
    local_210 = (long *)0x0;
    (**(code **)*local_218)(local_218,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  (**pDVar1->_vptr_Disposer)
            (pDVar1,(_func_int *)((long)&pSVar2->_vptr_Server + (long)pSVar2->_vptr_Server[-2]));
  kj::EventLoop::leaveScope(local_208);
  kj::EventLoop::~EventLoop(&local_88);
  return;
}

Assistant:

TEST(Capability, DynamicServerInheritance) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int callCount = 0;
  test::TestExtends::Client client1 =
      DynamicCapability::Client(kj::heap<TestExtendsDynamicImpl>(callCount))
          .castAs<test::TestExtends>();
  test::TestInterface::Client client2 = client1;
  auto client = client2.castAs<test::TestExtends>();

  auto request1 = client.fooRequest();
  request1.setI(321);
  auto promise1 = request1.send();

  auto request2 = client.graultRequest();
  auto promise2 = request2.send();

  EXPECT_EQ(0, callCount);

  auto response2 = promise2.wait(waitScope);

  checkTestMessage(response2);

  auto response1 = promise1.wait(waitScope);

  EXPECT_EQ("bar", response1.getX());

  EXPECT_EQ(2, callCount);
}